

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

ARKodeSPRKTable arkodeSymplecticMcLachlan4(void)

{
  ARKodeSPRKTable sprk_table;
  int in_stack_ffffffffffffffec;
  ARKodeSPRKTable local_8;
  
  local_8 = ARKodeSPRKTable_Alloc(in_stack_ffffffffffffffec);
  if (local_8 == (ARKodeSPRKTable)0x0) {
    local_8 = (ARKodeSPRKTable)0x0;
  }
  else {
    local_8->q = 4;
    local_8->stages = 4;
    *local_8->a = 0.5153528374311229;
    local_8->a[1] = -0.08578201941297364;
    local_8->a[2] = 0.4415830236164665;
    local_8->a[3] = 0.12884615836538418;
    *local_8->ahat = 0.1344961992774311;
    local_8->ahat[1] = -0.22481980307942082;
    local_8->ahat[2] = 0.7563200005156683;
    local_8->ahat[3] = 0.3340036032863214;
  }
  return local_8;
}

Assistant:

static ARKodeSPRKTable arkodeSymplecticMcLachlan4(void)
{
  ARKodeSPRKTable sprk_table = ARKodeSPRKTable_Alloc(4);
  if (!sprk_table) { return NULL; }
  sprk_table->q       = 4;
  sprk_table->stages  = 4;
  sprk_table->a[0]    = SUN_RCONST(0.515352837431122936);
  sprk_table->a[1]    = -SUN_RCONST(0.085782019412973646);
  sprk_table->a[2]    = SUN_RCONST(0.441583023616466524);
  sprk_table->a[3]    = SUN_RCONST(0.128846158365384185);
  sprk_table->ahat[0] = SUN_RCONST(0.134496199277431089);
  sprk_table->ahat[1] = -SUN_RCONST(0.224819803079420806);
  sprk_table->ahat[2] = SUN_RCONST(0.756320000515668291);
  sprk_table->ahat[3] = SUN_RCONST(0.33400360328632142);
  return sprk_table;
}